

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressure.cpp
# Opt level: O0

RTPressure * RTPressure::createPressure(RTIMUSettings *settings)

{
  bool bVar1;
  RTIMUSettings *settings_local;
  
  switch(settings->m_pressureType) {
  case 0:
    bVar1 = RTIMUSettings::discoverPressure
                      (settings,&settings->m_pressureType,&settings->m_I2CPressureAddress);
    if (bVar1) {
      (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
      settings_local = (RTIMUSettings *)createPressure(settings);
    }
    else {
      settings_local = (RTIMUSettings *)0x0;
    }
    break;
  case 1:
    settings_local = (RTIMUSettings *)0x0;
    break;
  case 2:
    settings_local = (RTIMUSettings *)operator_new(0x58);
    RTPressureBMP180::RTPressureBMP180((RTPressureBMP180 *)settings_local,settings);
    break;
  case 3:
    settings_local = (RTIMUSettings *)operator_new(0x20);
    RTPressureLPS25H::RTPressureLPS25H((RTPressureLPS25H *)settings_local,settings);
    break;
  case 4:
    settings_local = (RTIMUSettings *)operator_new(0x48);
    RTPressureMS5611::RTPressureMS5611((RTPressureMS5611 *)settings_local,settings);
    break;
  case 5:
    settings_local = (RTIMUSettings *)operator_new(0x48);
    RTPressureMS5637::RTPressureMS5637((RTPressureMS5637 *)settings_local,settings);
    break;
  default:
    settings_local = (RTIMUSettings *)0x0;
  }
  return (RTPressure *)settings_local;
}

Assistant:

RTPressure *RTPressure::createPressure(RTIMUSettings *settings)
{
    switch (settings->m_pressureType) {
    case RTPRESSURE_TYPE_BMP180:
        return new RTPressureBMP180(settings);

    case RTPRESSURE_TYPE_LPS25H:
        return new RTPressureLPS25H(settings);

    case RTPRESSURE_TYPE_MS5611:
        return new RTPressureMS5611(settings);

    case RTPRESSURE_TYPE_MS5637:
        return new RTPressureMS5637(settings);

    case RTPRESSURE_TYPE_AUTODISCOVER:
        if (settings->discoverPressure(settings->m_pressureType, settings->m_I2CPressureAddress)) {
            settings->saveSettings();
            return RTPressure::createPressure(settings);
        }
        return NULL;

    case RTPRESSURE_TYPE_NULL:
        return NULL;

    default:
        return NULL;
    }
}